

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::
    get_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
              (basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  basic_string_view<char> bVar1;
  handle hVar2;
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> custom;
  type tVar3;
  unsigned___int128 *in_stack_00000008;
  undefined2 in_stack_00000010;
  undefined6 in_stack_00000012;
  undefined4 in_stack_00000018;
  unsigned_long_long value;
  undefined2 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefa;
  float in_stack_fffffffffffffefc;
  bool bVar4;
  undefined2 in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff02;
  undefined8 in_stack_ffffffffffffff08;
  unsigned_long_long uVar5;
  width_checker *in_stack_ffffffffffffff10;
  width_checker *pwVar6;
  width_checker *in_stack_ffffffffffffff18;
  width_checker local_b9;
  unsigned_long_long local_b8;
  monostate local_a9 [17];
  handle local_98;
  basic_string_view<char> local_88;
  unsigned___int128 *local_78;
  unsigned___int128 *local_68;
  __int128 *local_48;
  __int128 *local_38;
  undefined8 *local_18;
  width_checker *local_10;
  unsigned_long_long local_8;
  
  local_18 = &stack0x00000008;
  pwVar6 = &local_b9;
  bVar4 = SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0);
  local_10 = pwVar6;
  switch(in_stack_00000018) {
  case 0:
  default:
    monostate::monostate(local_a9);
    local_8 = width_checker::operator()<fmt::v10::monostate,_0>(pwVar6);
    in_stack_ffffffffffffff10 = pwVar6;
    break;
  case 1:
    local_8 = width_checker::operator()<int,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         (int)in_stack_fffffffffffffefc);
    break;
  case 2:
    local_8 = width_checker::operator()<unsigned_int,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         (uint)in_stack_fffffffffffffefc);
    break;
  case 3:
    local_8 = width_checker::operator()<long_long,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         CONCAT44(in_stack_fffffffffffffefc,
                                  CONCAT22(in_stack_fffffffffffffefa,in_stack_fffffffffffffef8)));
    break;
  case 4:
    local_8 = width_checker::operator()<unsigned_long_long,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         CONCAT44(in_stack_fffffffffffffefc,
                                  CONCAT22(in_stack_fffffffffffffefa,in_stack_fffffffffffffef8)));
    break;
  case 5:
    value_00._2_2_ = in_stack_fffffffffffffefa;
    value_00._0_2_ = in_stack_fffffffffffffef8;
    value_00._4_4_ = in_stack_fffffffffffffefc;
    value_00._8_2_ = in_stack_ffffffffffffff00;
    value_00._10_6_ = in_stack_ffffffffffffff02;
    local_48 = convert_for_visit<__int128>((__int128 *)in_stack_00000008,(__int128)value_00);
    value_02._2_6_ = in_stack_ffffffffffffff02;
    value_02._0_2_ = in_stack_ffffffffffffff00;
    value_02._8_8_ = in_stack_ffffffffffffff08;
    local_38 = local_48;
    local_8 = width_checker::operator()<__int128,_0>(in_stack_ffffffffffffff18,(__int128)value_02);
    break;
  case 6:
    value_01._2_2_ = in_stack_fffffffffffffefa;
    value_01._0_2_ = in_stack_fffffffffffffef8;
    value_01._4_4_ = in_stack_fffffffffffffefc;
    value_01._8_2_ = in_stack_ffffffffffffff00;
    value_01._10_6_ = in_stack_ffffffffffffff02;
    local_78 = convert_for_visit<unsigned__int128>
                         (in_stack_00000008,(detail *)CONCAT62(in_stack_00000012,in_stack_00000010),
                          (unsigned___int128)value_01);
    value_03._2_6_ = in_stack_ffffffffffffff02;
    value_03._0_2_ = in_stack_ffffffffffffff00;
    value_03._8_8_ = in_stack_ffffffffffffff08;
    local_68 = local_78;
    local_8 = width_checker::operator()<unsigned___int128,_0>
                        (in_stack_ffffffffffffff18,(unsigned___int128)value_03);
    break;
  case 7:
    local_8 = width_checker::operator()<bool,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),bVar4);
    break;
  case 8:
    local_8 = width_checker::operator()<char,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),bVar4);
    break;
  case 9:
    local_8 = width_checker::operator()<float,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffefc);
    break;
  case 10:
    local_8 = width_checker::operator()<double,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         (double)CONCAT44(in_stack_fffffffffffffefc,
                                          CONCAT22(in_stack_fffffffffffffefa,
                                                   in_stack_fffffffffffffef8)));
    break;
  case 0xb:
    local_8 = width_checker::operator()<long_double,_0>
                        ((width_checker *)CONCAT62(in_stack_ffffffffffffff02,in_stack_00000010),
                         (longdouble)CONCAT28((short)in_stack_00000008,0x2b65f0));
    break;
  case 0xc:
    local_8 = width_checker::operator()<const_char_*,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         (char *)CONCAT44(in_stack_fffffffffffffefc,
                                          CONCAT22(in_stack_fffffffffffffefa,
                                                   in_stack_fffffffffffffef8)));
    break;
  case 0xd:
    basic_string_view<char>::basic_string_view
              (&local_88,(char *)in_stack_00000008,CONCAT62(in_stack_00000012,in_stack_00000010));
    bVar1.data_._2_2_ = in_stack_fffffffffffffefa;
    bVar1.data_._0_2_ = in_stack_fffffffffffffef8;
    bVar1.data_._4_4_ = in_stack_fffffffffffffefc;
    bVar1.size_._0_2_ = in_stack_ffffffffffffff00;
    bVar1.size_._2_6_ = in_stack_ffffffffffffff02;
    local_8 = width_checker::operator()<fmt::v10::basic_string_view<char>,_0>
                        ((width_checker *)0x2b666d,bVar1);
    break;
  case 0xe:
    local_8 = width_checker::operator()<const_void_*,_0>
                        ((width_checker *)
                         CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                         (void *)CONCAT44(in_stack_fffffffffffffefc,
                                          CONCAT22(in_stack_fffffffffffffefa,
                                                   in_stack_fffffffffffffef8)));
    break;
  case 0xf:
    custom.format._0_2_ = in_stack_00000010;
    custom.value = in_stack_00000008;
    custom.format._2_6_ = in_stack_00000012;
    basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle::handle
              (&local_98,custom);
    hVar2.custom_.value._2_2_ = in_stack_fffffffffffffefa;
    hVar2.custom_.value._0_2_ = in_stack_fffffffffffffef8;
    hVar2.custom_.value._4_4_ = in_stack_fffffffffffffefc;
    hVar2.custom_.format._0_2_ = in_stack_ffffffffffffff00;
    hVar2.custom_.format._2_6_ = in_stack_ffffffffffffff02;
    local_8 = width_checker::
              operator()<fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle,_0>
                        ((width_checker *)0x2b66ed,hVar2);
  }
  local_b8 = local_8;
  uVar5 = local_8;
  max_value<int>();
  tVar3 = to_unsigned<int>(0);
  if (uVar5 <= tVar3) {
    return (int)local_b8;
  }
  throw_format_error((char *)in_stack_ffffffffffffff10);
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg) -> int {
  unsigned long long value = visit_format_arg(Handler(), arg);
  if (value > to_unsigned(max_value<int>()))
    throw_format_error("number is too big");
  return static_cast<int>(value);
}